

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_connection.c
# Opt level: O1

apx_error_t
apx_serverConnection_create
          (apx_serverConnection_t *self,apx_connectionBaseVTable_t *base_connection_vtable,
          apx_connectionInterface_t *connection_interface)

{
  apx_error_t aVar1;
  
  if (self != (apx_serverConnection_t *)0x0) {
    base_connection_vtable->node_created_notification =
         apx_serverConnection_vnode_created_notification;
    connection_interface->remote_file_published_notification =
         apx_serverConnection_vremote_file_published_notification;
    connection_interface->remote_file_write_notification =
         apx_serverConnection_vremote_file_write_notification;
    aVar1 = apx_connectionBase_create
                      (&self->base,'\x02',base_connection_vtable,connection_interface);
    self->is_greeting_accepted = false;
    self->parent = (apx_server_tag *)0x0;
    self->last_error = 0;
    return aVar1;
  }
  return 1;
}

Assistant:

apx_error_t apx_serverConnection_create(apx_serverConnection_t* self, apx_connectionBaseVTable_t* base_connection_vtable, apx_connectionInterface_t* connection_interface)
{
   if (self != 0)
   {
      apx_error_t error_code;
      //init non-overridable virtual functions
      base_connection_vtable->node_created_notification = apx_serverConnection_vnode_created_notification;
      connection_interface->remote_file_published_notification = apx_serverConnection_vremote_file_published_notification;
      connection_interface->remote_file_write_notification = apx_serverConnection_vremote_file_write_notification;
      error_code = apx_connectionBase_create(&self->base, APX_SERVER_MODE, base_connection_vtable, connection_interface);
      self->is_greeting_accepted = false;
      self->parent = NULL;
      self->last_error = APX_NO_ERROR;
      //apx_connectionBase_setEventHandler(&self->base, apx_serverConnection_defaultEventHandler, (void*) self);
      return error_code;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}